

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O0

string * std::
         format<char,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::basic_string_view<char,std::char_traits<char>>&>
                   (string_view fmt,char *ts,
                   time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *ts_1,basic_string_view<char,_std::char_traits<char>_> *ts_2)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  char *pcVar1;
  ulong uVar2;
  const_iterator pvVar3;
  reference pvVar4;
  size_type sVar5;
  char *pcVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  basic_ostream<char,_std::char_traits<char>_> *__os;
  const_iterator pvVar9;
  char *in_RCX;
  string *in_RDI;
  stringstream ss;
  const_iterator frag;
  const_iterator parser;
  const_iterator start;
  size_t index;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> fragments;
  size_type in_stack_fffffffffffffb18;
  const_iterator pvVar10;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffb20;
  size_t in_stack_fffffffffffffb28;
  char *in_stack_fffffffffffffb30;
  basic_string_view<char,_std::char_traits<char>_> *local_480;
  ostream *in_stack_fffffffffffffbd8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffbe0;
  stringstream local_408 [392];
  const_iterator local_280;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  char *local_248;
  char *local_240;
  ulong local_238;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> local_230;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  char *local_20;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_20 = in_RCX;
  memset(&local_230,0,0x200);
  local_480 = local_230._M_elems;
  do {
    webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_480);
    local_480 = local_480 + 1;
  } while (local_480 != &local_30);
  local_238 = 0;
  local_248 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cbegin
                        (&local_18);
  local_240 = local_248;
  for (; pcVar6 = local_248,
      pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend
                         (&local_18), pcVar1 = local_240, pcVar6 != pvVar3;
      local_248 = local_248 + 1) {
    if (*local_248 == '{') {
      pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cbegin
                         (&local_18);
      uVar2 = local_238;
      if (pcVar1 == pvVar3) {
        webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_258,local_240,(long)local_248 - (long)local_240);
        local_238 = local_238 + 1;
        pvVar4 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::operator[]
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        pvVar4->_M_len = local_258._M_len;
        pvVar4->_M_str = local_258._M_str;
      }
      else if ((local_240 != local_248) &&
              (sVar5 = webfront::http::std::
                       array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::size
                                 (&local_230), uVar2 < sVar5)) {
        webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_268,local_240 + 1,(long)local_248 - (long)(local_240 + 1));
        local_238 = local_238 + 1;
        pvVar4 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::operator[]
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        pvVar4->_M_len = local_268._M_len;
        pvVar4->_M_str = local_268._M_str;
      }
    }
    else if (*local_248 == '}') {
      local_240 = local_248;
    }
  }
  pcVar6 = local_240 + 1;
  pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend(&local_18);
  if (pcVar6 != pvVar3) {
    pcVar6 = local_240 + 1;
    pvVar3 = webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::cend(&local_18);
    webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_278,pcVar6,(long)pvVar3 - (long)(local_240 + 1));
    local_238 = local_238 + 1;
    pvVar4 = webfront::http::std::array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>
             ::operator[]((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                          in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
    pvVar4->_M_len = local_278._M_len;
    pvVar4->_M_str = local_278._M_str;
  }
  local_280 = webfront::http::std::
              array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::cbegin
                        ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                         0x114cf6);
  std::__cxx11::stringstream::stringstream(local_408);
  local_280 = local_280 + 1;
  __str._M_str = in_stack_fffffffffffffb30;
  __str._M_len = in_stack_fffffffffffffb28;
  pbVar7 = operator<<(in_stack_fffffffffffffb20,__str);
  std::operator<<(pbVar7,*local_20);
  local_280 = local_280 + 1;
  __str_00._M_str = (char *)pbVar7;
  __str_00._M_len = in_stack_fffffffffffffb28;
  pbVar8 = operator<<(in_stack_fffffffffffffb20,__str_00);
  webfront::operator<<(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbe0);
  local_280 = local_280 + 1;
  __str_01._M_str = (char *)pbVar7;
  __str_01._M_len = (size_t)pbVar8;
  __os = operator<<(in_stack_fffffffffffffb20,__str_01);
  __str_02._M_str = (char *)pbVar7;
  __str_02._M_len = (size_t)pbVar8;
  operator<<(__os,__str_02);
  while (pvVar10 = local_280,
        pvVar9 = webfront::http::std::
                 array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL>::cend
                           ((array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> *)
                            0x114e65), pvVar10 != pvVar9) {
    local_280 = local_280 + 1;
    __str_03._M_str = (char *)pbVar7;
    __str_03._M_len = (size_t)pbVar8;
    operator<<(__os,__str_03);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_408);
  return in_RDI;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}